

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::detail::
assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 in_register_00000004;
  int line_00;
  ulong local_38;
  quiescent_state_on_scope_exit qStack_34;
  
  local_38 = CONCAT44(in_register_00000004,(int)file);
  uVar2 = std::uncaught_exceptions();
  uVar1 = local_38;
  local_38 = CONCAT44(uVar2,line_00);
  do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            (this,db,key,expected,(char *)(uVar1 & 0xffffffff),line_00);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit(&qStack_34);
  return;
}

Assistant:

void assert_result_eq(const Db &db, typename Db::key_type key,
                      unodb::value_view expected, const char *file, int line) {
  if constexpr (is_olc_db<Db>) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    do_assert_result_eq<Db>(db, key, expected, file, line);
  } else {
    do_assert_result_eq<Db>(db, key, expected, file, line);
  }
}